

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int scaling_list_data(GetBitContext *gb,ScalingList *sl,HEVCSPS *sps)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int local_9c;
  int32_t scaling_list_delta_coef;
  int coef_num;
  int next_coef;
  uint delta;
  int i;
  int pos;
  int matrix_id;
  int size_id;
  int32_t scaling_list_dc_coef [2] [6];
  uint8_t scaling_list_pred_mode_flag;
  HEVCSPS *sps_local;
  ScalingList *sl_local;
  GetBitContext *gb_local;
  uint local_14;
  uint8_t result;
  uint32_t index;
  
  pos = 0;
  do {
    if (3 < pos) {
      if (sps->chroma_format_idc == 3) {
        for (next_coef = 0; next_coef < 0x40; next_coef = next_coef + 1) {
          sl->sl[3][1][next_coef] = sl->sl[2][1][next_coef];
          sl->sl[3][2][next_coef] = sl->sl[2][2][next_coef];
          *(uint8_t *)((long)(sl->sl_dc + -0x16) + (long)next_coef + 4) = sl->sl[2][4][next_coef];
          *(uint8_t *)((long)(sl->sl_dc + -0xb) + (long)next_coef + 2) = sl->sl[2][5][next_coef];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
      }
      return 0;
    }
    for (i = 0; i < 6; i = iVar4 + i) {
      local_14 = gb->index;
      uVar1 = gb->buffer[local_14 >> 3];
      bVar2 = (byte)local_14;
      if (gb->index < gb->size_in_bits_plus8) {
        local_14 = local_14 + 1;
      }
      gb->index = local_14;
      if ((char)((int)(uint)(byte)(uVar1 << (bVar2 & 7)) >> 7) == '\0') {
        uVar3 = get_ue_golomb_long(gb);
        if (uVar3 != 0) {
          if ((uint)i < uVar3) {
            fprintf(_stderr,"Invalid delta in scaling list data: %d.\n",(ulong)uVar3);
            return -1;
          }
          iVar4 = 0x10;
          if (0 < pos) {
            iVar4 = 0x40;
          }
          memcpy(sl->sl[pos] + i,sl->sl[pos] + (i - uVar3),(long)iVar4);
          if (1 < pos) {
            sl->sl_dc[pos + -2][i] = sl->sl_dc[pos + -2][i - uVar3];
          }
        }
      }
      else {
        scaling_list_delta_coef = 8;
        if (1 << ((char)(pos << 1) + 4U & 0x1f) < 0x40) {
          local_9c = 1 << ((char)(pos << 1) + 4U & 0x1f);
        }
        else {
          local_9c = 0x40;
        }
        if (1 < pos) {
          iVar4 = get_se_golomb(gb);
          (&matrix_id)[(long)(pos + -2) * 6 + (long)i] = iVar4 + 8;
          scaling_list_delta_coef = (&matrix_id)[(long)(pos + -2) * 6 + (long)i];
          sl->sl_dc[pos + -2][i] = (uint8_t)scaling_list_delta_coef;
        }
        for (next_coef = 0; next_coef < local_9c; next_coef = next_coef + 1) {
          if (pos == 0) {
            delta = (uint)""[next_coef] * 4 + (uint)""[next_coef];
          }
          else {
            delta = (uint)""[next_coef] * 8 + (uint)""[next_coef];
          }
          iVar4 = get_se_golomb(gb);
          scaling_list_delta_coef = (scaling_list_delta_coef + iVar4 + 0x100) % 0x100;
          sl->sl[pos][i][(int)delta] = (uint8_t)scaling_list_delta_coef;
        }
      }
      iVar4 = 1;
      if (pos == 3) {
        iVar4 = 3;
      }
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

static int scaling_list_data(GetBitContext *gb, ScalingList *sl, HEVCSPS *sps)
{
    uint8_t scaling_list_pred_mode_flag;
    int32_t scaling_list_dc_coef[2][6];
    int size_id, matrix_id, pos;
    int i;

    for (size_id = 0; size_id < 4; size_id++)
    {
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1))
        {
            scaling_list_pred_mode_flag = (uint8_t) get_bits1(gb);
            if (!scaling_list_pred_mode_flag)
            {
                unsigned int delta = get_ue_golomb_long(gb);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta)
                {
                    // Copy from previous array.
                    if (matrix_id < delta)
                    {
                        fprintf(stderr, "Invalid delta in scaling list data: %d.\n", delta);
                        return -1;
                    }
                    memcpy(sl->sl[size_id][matrix_id], sl->sl[size_id][matrix_id - delta], size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            }
            else
            {
                int next_coef, coef_num;
                int32_t scaling_list_delta_coef;

                next_coef = 8;
                coef_num = FFMIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1)
                {
                    scaling_list_dc_coef[size_id - 2][matrix_id] = get_se_golomb(gb) + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = (uint8_t)next_coef;
                }
                for (i = 0; i < coef_num; i++)
                {
                    if (size_id == 0)
                        pos = 4 * hevc_diag_scan4x4_y[i] + hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * hevc_diag_scan8x8_y[i] + hevc_diag_scan8x8_x[i];

                    scaling_list_delta_coef = get_se_golomb(gb);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = (uint8_t)next_coef;
                }
            }
        }
    }
    if (sps->chroma_format_idc == 3)
    {
        for (i = 0; i < 64; i++)
        {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
}